

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O0

bool __thiscall
glcts::anon_unknown_0::BasicDispatchIndirect::RunIteration
          (BasicDispatchIndirect *this,GLintptr offset,GLuint buffer_size)

{
  ulong uVar1;
  reference data_00;
  void *pvVar2;
  uint local_60;
  bool local_59;
  GLuint i;
  bool res;
  GLuint *result;
  allocator<unsigned_int> local_39;
  undefined1 local_38 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> data;
  GLuint buffer_size_local;
  GLintptr offset_local;
  BasicDispatchIndirect *this_local;
  
  data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = buffer_size;
  std::allocator<unsigned_int>::allocator(&local_39);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,(ulong)buffer_size,
             &local_39);
  std::allocator<unsigned_int>::~allocator(&local_39);
  if (this->m_storage_buffer == 0) {
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->m_storage_buffer);
  }
  glu::CallLogWrapper::glBindBufferBase
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2,0,this->m_storage_buffer);
  uVar1 = (ulong)data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_;
  data_00 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,0);
  glu::CallLogWrapper::glBufferData
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2,uVar1 << 2,data_00,0x88e8);
  glu::CallLogWrapper::glDispatchComputeIndirect
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,offset);
  glu::CallLogWrapper::glMemoryBarrier
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x200);
  pvVar2 = glu::CallLogWrapper::glMapBufferRange
                     (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                       super_CallLogWrapper,0x90d2,0,
                      (ulong)data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ << 2,1);
  local_59 = true;
  for (local_60 = 0;
      local_60 <
      data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_; local_60 = local_60 + 1) {
    if (*(uint *)((long)pvVar2 + (ulong)local_60 * 4) != local_60) {
      anon_unknown_0::Output
                ("Data at index %d is %d should be %d.\n",(ulong)local_60,
                 (ulong)*(uint *)((long)pvVar2 + (ulong)local_60 * 4));
      local_59 = false;
    }
  }
  glu::CallLogWrapper::glUnmapBuffer
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2,0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  return local_59;
}

Assistant:

bool RunIteration(GLintptr offset, GLuint buffer_size)
	{
		std::vector<GLuint> data(buffer_size);
		if (m_storage_buffer == 0)
			glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(GLuint) * buffer_size, &data[0], GL_DYNAMIC_DRAW);

		glDispatchComputeIndirect(offset);

		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		GLuint* result;
		result = static_cast<GLuint*>(
			glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(GLuint) * buffer_size, GL_MAP_READ_BIT));
		bool res = true;
		for (GLuint i = 0; i < buffer_size; ++i)
		{
			if (result[i] != i)
			{
				Output("Data at index %d is %d should be %d.\n", i, result[i], i);
				res = false;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		return res;
	}